

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codaeval.c
# Opt level: O0

int callback(char *filepath,coda_filefilter_status status,char *error,void *userdata)

{
  void *userdata_local;
  char *error_local;
  coda_filefilter_status status_local;
  char *filepath_local;
  
  if (status == coda_ffs_error) {
    fprintf(_stderr,"ERROR: %s for %s\n",error,filepath);
  }
  else if (status == coda_ffs_could_not_access_directory) {
    fprintf(_stderr,"ERROR: unable to access directory %s\n",filepath);
  }
  else if (status == coda_ffs_could_not_open_file) {
    fprintf(_stderr,"ERROR: could not open file %s (%s)\n",filepath,error);
  }
  if (status == coda_ffs_match) {
    filepath_local._4_4_ = eval_expression_for_file(filepath);
  }
  else {
    filepath_local._4_4_ = 0;
  }
  return filepath_local._4_4_;
}

Assistant:

int callback(const char *filepath, coda_filefilter_status status, const char *error, void *userdata)
{
    (void)userdata;     /* prevent unused warning */

    if (status == coda_ffs_error)
    {
        fprintf(stderr, "ERROR: %s for %s\n", error, filepath);
    }
    else if (status == coda_ffs_could_not_access_directory)
    {
        fprintf(stderr, "ERROR: unable to access directory %s\n", filepath);
    }
    else if (status == coda_ffs_could_not_open_file)
    {
        fprintf(stderr, "ERROR: could not open file %s (%s)\n", filepath, error);
    }
    if (status == coda_ffs_match)
    {
        return eval_expression_for_file(filepath);
    }

    return 0;
}